

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O2

void __thiscall
llm_build_gemma2::llm_build_gemma2
          (llm_build_gemma2 *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  uint uVar1;
  ggml_context *pgVar2;
  pointer plVar3;
  uint uVar4;
  ggml_tensor *pgVar5;
  llm_graph_input_attn_kv_unified *inp;
  ggml_tensor *pgVar6;
  ggml_tensor *pgVar7;
  ggml_tensor *pgVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int il;
  long lVar11;
  float fVar12;
  undefined8 in_stack_ffffffffffffff48;
  undefined4 uVar13;
  long local_70;
  ggml_tensor *local_60;
  
  llm_graph_context::llm_graph_context(&this->super_llm_graph_context,params);
  uVar1 = ((this->super_llm_graph_context).hparams)->n_embd_head_k;
  pgVar5 = llm_graph_context::build_inp_embd(&this->super_llm_graph_context,model->tok_embd);
  fVar12 = (float)(this->super_llm_graph_context).n_embd;
  pgVar2 = (this->super_llm_graph_context).ctx0;
  if (fVar12 < 0.0) {
    fVar12 = sqrtf(fVar12);
  }
  else {
    fVar12 = SQRT(fVar12);
  }
  local_60 = (ggml_tensor *)ggml_scale(fVar12,pgVar2,pgVar5);
  llm_graph_context::cb(&this->super_llm_graph_context,local_60,"inp_scaled",-1);
  pgVar5 = llm_graph_context::build_inp_pos(&this->super_llm_graph_context);
  inp = llm_graph_context::build_attn_inp_kv_unified(&this->super_llm_graph_context);
  local_70 = 0;
  lVar11 = 0;
  while( true ) {
    uVar13 = (undefined4)((ulong)in_stack_ffffffffffffff48 >> 0x20);
    if ((this->super_llm_graph_context).n_layer <= lVar11) {
      pgVar5 = llm_graph_context::build_norm
                         (&this->super_llm_graph_context,local_60,model->output_norm,
                          (ggml_tensor *)0x0,LLM_NORM_RMS,-1);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"result_norm",-1);
      ((this->super_llm_graph_context).res._M_t.
       super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
       super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
       super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_embd = pgVar5;
      pgVar5 = llm_graph_context::build_lora_mm(&this->super_llm_graph_context,model->output,pgVar5)
      ;
      uVar9 = ggml_scale(1.0 / ((this->super_llm_graph_context).hparams)->f_final_logit_softcapping,
                         (this->super_llm_graph_context).ctx0,pgVar5);
      uVar9 = ggml_tanh((this->super_llm_graph_context).ctx0,uVar9);
      pgVar5 = (ggml_tensor *)
               ggml_scale(((this->super_llm_graph_context).hparams)->f_final_logit_softcapping,
                          (this->super_llm_graph_context).ctx0,uVar9);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"result_output",-1);
      ((this->super_llm_graph_context).res._M_t.
       super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
       super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
       super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_logits = pgVar5;
      ggml_build_forward_expand(gf,pgVar5);
      return;
    }
    il = (int)lVar11;
    pgVar6 = llm_graph_context::build_norm
                       (&this->super_llm_graph_context,local_60,
                        *(ggml_tensor **)
                         ((long)&((model->layers).
                                  super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->attn_norm + local_70),
                        (ggml_tensor *)0x0,LLM_NORM_RMS,il);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"attn_norm",il);
    pgVar7 = llm_graph_context::build_lora_mm
                       (&this->super_llm_graph_context,
                        *(ggml_tensor **)
                         ((long)&((model->layers).
                                  super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->wq + local_70),pgVar6);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar7,"Qcur",il);
    pgVar8 = llm_graph_context::build_lora_mm
                       (&this->super_llm_graph_context,
                        *(ggml_tensor **)
                         ((long)&((model->layers).
                                  super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->wk + local_70),pgVar6);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"Kcur",il);
    pgVar6 = llm_graph_context::build_lora_mm
                       (&this->super_llm_graph_context,
                        *(ggml_tensor **)
                         ((long)&((model->layers).
                                  super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->wv + local_70),pgVar6);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"Vcur",il);
    uVar9 = ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar7,uVar1,
                            (this->super_llm_graph_context).n_head,
                            (long)(this->super_llm_graph_context).n_tokens);
    uVar10 = ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar8,uVar1,
                             (this->super_llm_graph_context).n_head_kv,
                             (long)(this->super_llm_graph_context).n_tokens);
    pgVar6 = (ggml_tensor *)
             ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar6,uVar1,
                             (this->super_llm_graph_context).n_head_kv,
                             (long)(this->super_llm_graph_context).n_tokens);
    pgVar7 = (ggml_tensor *)
             ggml_rope_ext((this->super_llm_graph_context).freq_base,
                           (this->super_llm_graph_context).freq_scale,
                           (this->super_llm_graph_context).ext_factor,
                           (this->super_llm_graph_context).attn_factor,
                           (this->super_llm_graph_context).beta_fast,
                           (this->super_llm_graph_context).beta_slow,
                           (this->super_llm_graph_context).ctx0,uVar9,pgVar5,0,
                           (int)(this->super_llm_graph_context).n_rot,
                           (this->super_llm_graph_context).rope_type,
                           CONCAT44(uVar13,(this->super_llm_graph_context).n_ctx_orig));
    pgVar8 = (ggml_tensor *)
             ggml_rope_ext((this->super_llm_graph_context).freq_base,
                           (this->super_llm_graph_context).freq_scale,
                           (this->super_llm_graph_context).ext_factor,
                           (this->super_llm_graph_context).attn_factor,
                           (this->super_llm_graph_context).beta_fast,
                           (this->super_llm_graph_context).beta_slow,
                           (this->super_llm_graph_context).ctx0,uVar10,pgVar5,0,
                           (int)(this->super_llm_graph_context).n_rot,
                           (this->super_llm_graph_context).rope_type,
                           (this->super_llm_graph_context).n_ctx_orig);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar7,"Qcur",il);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"Kcur",il);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"Vcur",il);
    uVar4 = model->type - LLM_TYPE_2B;
    if ((0x27 < uVar4) || ((0x8000000201U >> ((ulong)uVar4 & 0x3f) & 1) == 0)) break;
    pgVar7 = (ggml_tensor *)
             ggml_scale(1.0 / SQRT((float)uVar1),(this->super_llm_graph_context).ctx0,pgVar7);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar7,"Qcur_scaled",il);
    pgVar6 = llm_graph_context::build_attn
                       (&this->super_llm_graph_context,inp,gf,
                        *(ggml_tensor **)
                         ((long)&((model->layers).
                                  super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->wo + local_70),
                        (ggml_tensor *)0x0,pgVar7,pgVar8,pgVar6,(ggml_tensor *)0x0,
                        (ggml_tensor *)0x0,1.0,il);
    pgVar6 = llm_graph_context::build_norm
                       (&this->super_llm_graph_context,pgVar6,
                        *(ggml_tensor **)
                         ((long)&((model->layers).
                                  super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->attn_post_norm +
                         local_70),(ggml_tensor *)0x0,LLM_NORM_RMS,il);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"attn_post_norm",il);
    if (lVar11 == (this->super_llm_graph_context).n_layer + -1) {
      pgVar7 = llm_graph_context::build_inp_out_ids(&this->super_llm_graph_context);
      pgVar6 = (ggml_tensor *)ggml_get_rows((this->super_llm_graph_context).ctx0,pgVar6,pgVar7);
      local_60 = (ggml_tensor *)ggml_get_rows((this->super_llm_graph_context).ctx0,local_60,pgVar7);
    }
    pgVar6 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar6,local_60);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"sa_out",il);
    pgVar7 = llm_graph_context::build_norm
                       (&this->super_llm_graph_context,pgVar6,
                        *(ggml_tensor **)
                         ((long)&((model->layers).
                                  super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->ffn_norm + local_70),
                        (ggml_tensor *)0x0,LLM_NORM_RMS,il);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar7,"ffn_norm",il);
    plVar3 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
             super__Vector_impl_data._M_start;
    in_stack_ffffffffffffff48 = 0;
    pgVar7 = llm_graph_context::build_ffn
                       (&this->super_llm_graph_context,pgVar7,
                        *(ggml_tensor **)((long)&plVar3->ffn_up + local_70),(ggml_tensor *)0x0,
                        (ggml_tensor *)0x0,*(ggml_tensor **)((long)&plVar3->ffn_gate + local_70),
                        (ggml_tensor *)0x0,(ggml_tensor *)0x0,
                        *(ggml_tensor **)((long)&plVar3->ffn_down + local_70),(ggml_tensor *)0x0,
                        (ggml_tensor *)0x0,(ggml_tensor *)0x0,LLM_FFN_GELU,LLM_FFN_PAR,il);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar7,"ffn_out",il);
    pgVar7 = llm_graph_context::build_norm
                       (&this->super_llm_graph_context,pgVar7,
                        *(ggml_tensor **)
                         ((long)&((model->layers).
                                  super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->ffn_post_norm +
                         local_70),(ggml_tensor *)0x0,LLM_NORM_RMS,-1);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar7,"ffn_post_norm",-1);
    pgVar6 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar7,pgVar6);
    local_60 = llm_graph_context::build_cvec(&this->super_llm_graph_context,pgVar6,il);
    llm_graph_context::cb(&this->super_llm_graph_context,local_60,"l_out",il);
    lVar11 = lVar11 + 1;
    local_70 = local_70 + 0x4f0;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
             ,0x203f,"fatal error");
}

Assistant:

llm_build_gemma2(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_k;

        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        inpL = ggml_scale(ctx0, inpL, sqrtf(n_embd));
        cb(inpL, "inp_scaled", -1);

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = build_inp_pos();

        auto * inp_attn = build_attn_inp_kv_unified();

        for (int il = 0; il < n_layer; ++il) {
            // norm
            cur = build_norm(inpL,
                    model.layers[il].attn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "attn_norm", il);

            // self-attention
            {
                // compute Q and K and RoPE them
                ggml_tensor * Qcur = build_lora_mm(model.layers[il].wq, cur);
                cb(Qcur, "Qcur", il);

                ggml_tensor * Kcur = build_lora_mm(model.layers[il].wk, cur);
                cb(Kcur, "Kcur", il);

                ggml_tensor * Vcur = build_lora_mm(model.layers[il].wv, cur);
                cb(Vcur, "Vcur", il);

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_embd_head, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_embd_head, n_head_kv, n_tokens);

                Qcur = ggml_rope_ext(
                        ctx0, Qcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow);

                Kcur = ggml_rope_ext(
                        ctx0, Kcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow);

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                // ref: https://github.com/google/gemma_pytorch/commit/03e657582d17cb5a8617ebf333c1c16f3694670e
                switch (model.type) {
                    case LLM_TYPE_2B:
                    case LLM_TYPE_9B:
                    case LLM_TYPE_27B: Qcur = ggml_scale(ctx0, Qcur, 1.0f / sqrtf(float(n_embd_head))); break;
                    default: GGML_ABORT("fatal error");
                };
                cb(Qcur, "Qcur_scaled", il);

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, NULL,
                        Qcur, Kcur, Vcur, nullptr, nullptr, 1.0f, il);
            }

            cur = build_norm(cur,
                    model.layers[il].attn_post_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "attn_post_norm", il);

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur  = ggml_get_rows(ctx0,  cur, inp_out_ids);
                inpL = ggml_get_rows(ctx0, inpL, inp_out_ids);
            }

            ggml_tensor * sa_out = ggml_add(ctx0, cur, inpL);
            cb(sa_out, "sa_out", il);

            cur = build_norm(sa_out,
                    model.layers[il].ffn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "ffn_norm", il);

            // feed-forward network
            {
                cur = build_ffn(cur,
                        model.layers[il].ffn_up,   NULL, NULL,
                        model.layers[il].ffn_gate, NULL, NULL,
                        model.layers[il].ffn_down, NULL, NULL,
                        NULL,
                        LLM_FFN_GELU, LLM_FFN_PAR, il);
                cb(cur, "ffn_out", il);
            }

            cur = build_norm(cur,
                    model.layers[il].ffn_post_norm, NULL,
                    LLM_NORM_RMS, -1);
            cb(cur, "ffn_post_norm", -1);

            cur = ggml_add(ctx0, cur, sa_out);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = inpL;

        cur = build_norm(cur,
                model.output_norm, NULL,
                LLM_NORM_RMS, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        // lm_head
        cur = build_lora_mm(model.output, cur);

        // final logit soft-capping
        cur = ggml_scale(ctx0, cur, 1.0f / hparams.f_final_logit_softcapping);
        cur = ggml_tanh(ctx0, cur);
        cur = ggml_scale(ctx0, cur, hparams.f_final_logit_softcapping);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }